

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3UniqueConstraint(Parse *pParse,int onError,Index *pIdx)

{
  Table *pTVar1;
  char *pcVar2;
  int errCode;
  char *zCol;
  Table *pTab;
  StrAccum errMsg;
  int j;
  char *zErr;
  Index *pIdx_local;
  int onError_local;
  Parse *pParse_local;
  
  pTVar1 = pIdx->pTable;
  sqlite3StrAccumInit((StrAccum *)&pTab,pParse->db,(char *)0x0,0,200);
  if (pIdx->aColExpr == (ExprList *)0x0) {
    errMsg.accError = '\0';
    errMsg.printfFlags = '\0';
    errMsg._30_2_ = 0;
    for (; (int)errMsg._28_4_ < (int)(uint)pIdx->nKeyCol; errMsg._28_4_ = errMsg._28_4_ + 1) {
      pcVar2 = pTVar1->aCol[pIdx->aiColumn[(int)errMsg._28_4_]].zName;
      if (errMsg._28_4_ != 0) {
        sqlite3_str_append((sqlite3_str *)&pTab,", ",2);
      }
      sqlite3_str_appendall((sqlite3_str *)&pTab,pTVar1->zName);
      sqlite3_str_append((sqlite3_str *)&pTab,".",1);
      sqlite3_str_appendall((sqlite3_str *)&pTab,pcVar2);
    }
  }
  else {
    sqlite3_str_appendf((StrAccum *)&pTab,"index \'%q\'",pIdx->zName);
  }
  pcVar2 = sqlite3StrAccumFinish((StrAccum *)&pTab);
  errCode = 0x813;
  if ((*(ushort *)&pIdx->field_0x63 & 3) == 2) {
    errCode = 0x613;
  }
  sqlite3HaltConstraint(pParse,errCode,onError,pcVar2,-7,'\x02');
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3UniqueConstraint(
  Parse *pParse,    /* Parsing context */
  int onError,      /* Constraint type */
  Index *pIdx       /* The index that triggers the constraint */
){
  char *zErr;
  int j;
  StrAccum errMsg;
  Table *pTab = pIdx->pTable;

  sqlite3StrAccumInit(&errMsg, pParse->db, 0, 0, 200);
  if( pIdx->aColExpr ){
    sqlite3_str_appendf(&errMsg, "index '%q'", pIdx->zName);
  }else{
    for(j=0; j<pIdx->nKeyCol; j++){
      char *zCol;
      assert( pIdx->aiColumn[j]>=0 );
      zCol = pTab->aCol[pIdx->aiColumn[j]].zName;
      if( j ) sqlite3_str_append(&errMsg, ", ", 2);
      sqlite3_str_appendall(&errMsg, pTab->zName);
      sqlite3_str_append(&errMsg, ".", 1);
      sqlite3_str_appendall(&errMsg, zCol);
    }
  }
  zErr = sqlite3StrAccumFinish(&errMsg);
  sqlite3HaltConstraint(pParse, 
    IsPrimaryKeyIndex(pIdx) ? SQLITE_CONSTRAINT_PRIMARYKEY 
                            : SQLITE_CONSTRAINT_UNIQUE,
    onError, zErr, P4_DYNAMIC, P5_ConstraintUnique);
}